

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CustomBulletAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  uint flags;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  VMValue *pVVar8;
  VMValue *pVVar9;
  VMValue *pVVar10;
  AActor *pAVar11;
  PClass *pPVar12;
  AActor *proj;
  AActor *puff;
  int damage;
  AActor *origin;
  char *pcVar13;
  bool bVar14;
  ulong uVar15;
  void *pvVar16;
  void *pvVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  DVector2 v;
  PClassActor *local_158;
  FName local_118;
  FName local_114;
  PClassActor *local_110;
  double local_108;
  AActor *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  AActor *local_e0;
  void *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  DAngle local_b8;
  DAngle local_b0;
  DAngle local_a8;
  DAngle local_a0;
  DAngle local_98;
  undefined1 local_90 [20];
  FSoundID local_7c;
  undefined1 local_78 [16];
  DThinker *local_60;
  undefined1 local_58 [24];
  DAngle local_40;
  DAngle local_38;
  
  pPVar12 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = *(AActor **)&param->field_0;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar7 = (origin->super_DThinker).super_DObject.Class;
        bVar14 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar12 && bVar14) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar14 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar12) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar14) {
          pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003caeff;
        }
      }
      if (numparam == 1) {
        pcVar13 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar13 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar13 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  if (numparam < 5) {
                    pcVar13 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      local_e8 = param[1].field_0.field_1.a;
                      local_f0 = param[2].field_0.field_1.a;
                      iVar4 = param[3].field_0.i;
                      iVar2 = param[4].field_0.i;
                      if (numparam == 5) {
                        pVVar10 = defaultparam->Array;
                        if ((pVVar10[5].field_0.field_3.Type != '\x03') ||
                           ((pVVar8 = pVVar10 + 5, pVVar10[5].field_0.field_1.atag != 1 &&
                            ((pVVar8->field_0).field_1.a != (void *)0x0)))) {
                          pcVar13 = 
                          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                          ;
LAB_003caec1:
                          __assert_fail(pcVar13,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x652,
                                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      else if ((param[5].field_0.field_3.Type != '\x03') ||
                              ((pVVar8 = param + 5, param[5].field_0.field_1.atag != 1 &&
                               ((pVVar8->field_0).field_1.a != (void *)0x0)))) {
                        pcVar13 = 
                        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ;
                        goto LAB_003caec1;
                      }
                      local_158 = (PClassActor *)(pVVar8->field_0).field_1.a;
                      if (numparam < 7) {
                        pVVar8 = defaultparam->Array;
                        if (pVVar8[6].field_0.field_3.Type != '\x01') {
                          pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                          goto LAB_003caf1e;
                        }
                      }
                      else {
                        pVVar8 = param;
                        if (param[6].field_0.field_3.Type != '\x01') {
                          pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003caf1e:
                          __assert_fail(pcVar13,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x653,
                                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      dVar1 = pVVar8[6].field_0.f;
                      if (numparam < 8) {
                        pVVar8 = defaultparam->Array;
                        if (pVVar8[7].field_0.field_3.Type != '\0') {
                          pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
                          goto LAB_003caf3d;
                        }
                      }
                      else {
                        pVVar8 = param;
                        if (param[7].field_0.field_3.Type != '\0') {
                          pcVar13 = "(param[paramnum]).Type == REGT_INT";
LAB_003caf3d:
                          __assert_fail(pcVar13,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x654,
                                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      flags = pVVar8[7].field_0.i;
                      if (numparam < 9) {
                        pVVar8 = defaultparam->Array;
                        if (pVVar8[8].field_0.field_3.Type != '\0') {
                          pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
                          goto LAB_003caf5c;
                        }
                      }
                      else {
                        pVVar8 = param;
                        if (param[8].field_0.field_3.Type != '\0') {
                          pcVar13 = "(param[paramnum]).Type == REGT_INT";
LAB_003caf5c:
                          __assert_fail(pcVar13,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x655,
                                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      if (numparam < 10) {
                        pVVar10 = defaultparam->Array;
                        if ((pVVar10[9].field_0.field_3.Type != '\x03') ||
                           ((pVVar9 = pVVar10 + 9, pVVar10[9].field_0.field_1.atag != 1 &&
                            ((pVVar9->field_0).field_1.a != (void *)0x0)))) {
                          pcVar13 = 
                          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                          ;
                          goto LAB_003caee0;
                        }
                      }
                      else if ((param[9].field_0.field_3.Type != '\x03') ||
                              ((pVVar9 = param + 9, param[9].field_0.field_1.atag != 1 &&
                               ((pVVar9->field_0).field_1.a != (void *)0x0)))) {
                        pcVar13 = 
                        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ;
LAB_003caee0:
                        __assert_fail(pcVar13,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                      ,0x656,
                                      "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
                      local_110 = (PClassActor *)(pVVar9->field_0).field_1.a;
                      if (numparam < 0xb) {
                        pVVar10 = defaultparam->Array;
                        if (pVVar10[10].field_0.field_3.Type != '\x01') {
                          pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                          goto LAB_003caf7b;
                        }
                      }
                      else {
                        pVVar10 = param;
                        if (param[10].field_0.field_3.Type != '\x01') {
                          pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003caf7b:
                          __assert_fail(pcVar13,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x657,
                                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      local_d8 = pVVar10[10].field_0.field_1.a;
                      if (numparam < 0xc) {
                        param = defaultparam->Array;
                        if (param[0xb].field_0.field_3.Type == '\x01') goto LAB_003ca8eb;
                        pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                      }
                      else {
                        if (param[0xb].field_0.field_3.Type == '\x01') {
LAB_003ca8eb:
                          local_f8 = param[0xb].field_0.field_1.a;
                          pAVar11 = COPY_AAPTR(origin,pVVar8[8].field_0.i);
                          if ((pAVar11 != (AActor *)0x0) || ((flags & 1) != 0)) {
                            if ((flags & 1) == 0) {
                              local_38.Degrees = 0.0;
                              local_40.Degrees = 270.0;
                              local_58._16_8_ = 0.0;
                              local_58._8_8_ = 0.0;
                              A_Face(origin,pAVar11,&local_38,&local_40,(DAngle *)(local_58 + 0x10),
                                     (DAngle *)(local_58 + 8),0,0.0);
                            }
                            local_100 = (AActor *)(origin->Angles).Yaw.Degrees;
                            local_108 = 0.0;
                            if ((flags & 8) == 0) {
                              local_60 = (DThinker *)0x0;
                              local_58._0_8_ = local_100;
                              P_AimLineAttack((AActor *)local_90,(DAngle *)origin,2048.0,
                                              (FTranslatedLineTarget *)local_58,(DAngle *)0x0,
                                              (int)&local_60,(AActor *)0x0,(AActor *)0x0);
                              local_108 = (double)CONCAT44(local_90._4_4_,local_90._0_4_);
                            }
                            if (local_158 == (PClassActor *)0x0) {
                              local_90._0_4_ = 0x40;
                              pPVar12 = PClass::FindClass((FName *)local_90);
                              local_158 = dyn_cast<PClassActor>((DObject *)pPVar12);
                            }
                            local_7c.ID = (origin->AttackSound).super_FSoundID.ID;
                            S_Sound(origin,1,&local_7c,1.0,1.0);
                            if (0 < iVar4) {
                              uVar15 = -(ulong)(dVar1 == 0.0);
                              auVar20._0_8_ = ~uVar15 & (ulong)dVar1;
                              auVar20._8_8_ = 0;
                              local_78 = auVar20 | ZEXT416((uint)(uVar15 >> 0x20) & 0x40a00000) <<
                                                   0x20;
                              bVar14 = local_110 != (PClassActor *)0x0;
                              local_e0 = origin;
                              do {
                                pvVar17 = local_f0;
                                pvVar16 = local_e8;
                                if ((flags & 4) == 0) {
                                  uVar5 = FRandom::GenRand32(&pr_cwbullet);
                                  uVar6 = FRandom::GenRand32(&pr_cwbullet);
                                  pvVar16 = (void *)(((double)(int)((uVar5 & 0xff) - (uVar6 & 0xff))
                                                     / 255.0) * (double)local_e8);
                                  uVar5 = FRandom::GenRand32(&pr_cwbullet);
                                  uVar6 = FRandom::GenRand32(&pr_cwbullet);
                                  pvVar17 = (void *)(((double)(int)((uVar5 & 0xff) - (uVar6 & 0xff))
                                                     / 255.0) * (double)local_f0);
                                  origin = local_e0;
                                }
                                damage = iVar2;
                                if ((flags & 2) == 0) {
                                  uVar5 = FRandom::GenRand32(&pr_cabullet);
                                  damage = ((uVar5 & 0xff) % 3 + 1) * iVar2;
                                }
                                dVar1 = (double)pvVar16 + (double)local_100;
                                dVar18 = (double)pvVar17 + local_108;
                                local_114.Index = 0xcd;
                                local_a0.Degrees = dVar18;
                                local_98.Degrees = dVar1;
                                pAVar11 = P_LineAttack(origin,&local_98,(double)local_78._0_8_,
                                                       &local_a0,damage,&local_114,local_158,
                                                       flags >> 3 & 2,(FTranslatedLineTarget *)0x0,
                                                       (int *)0x0);
                                if (local_158 != (PClassActor *)0x0 && bVar14) {
                                  dVar3 = FFastTrig::cos(&fasttrig,
                                                         dVar1 * 11930464.711111112 +
                                                         6755399441055744.0);
                                  dVar3 = dVar3 * (double)local_f8;
                                  dVar19 = FFastTrig::sin(&fasttrig,dVar3);
                                  local_c8 = (origin->__Pos).X;
                                  local_d0 = (origin->__Pos).Y;
                                  local_c0 = (origin->__Pos).Z;
                                  P_GetOffsetPosition(local_c8,local_d0,dVar3,
                                                      dVar19 * (double)local_f8);
                                  dVar19 = (origin->__Pos).Z + 0.0;
                                  (origin->__Pos).Z = dVar19;
                                  (origin->__Pos).X =
                                       (double)CONCAT44(local_90._4_4_,local_90._0_4_);
                                  (origin->__Pos).Y = (double)local_90._8_8_;
                                  dVar3 = AActor::GetBobOffset(origin,0.0);
                                  local_a8.Degrees = (origin->Angles).Yaw.Degrees;
                                  proj = P_SpawnMissileAngleZSpeed
                                                   (origin,dVar3 + dVar19 + (double)local_d8,
                                                    local_110,&local_a8,0.0,
                                                    *(double *)
                                                     ((local_110->super_PClass).Defaults + 0xe0),
                                                    origin,false);
                                  (origin->__Pos).Z = local_c0;
                                  (origin->__Pos).Y = local_d0;
                                  (origin->__Pos).X = local_c8;
                                  if (proj != (AActor *)0x0) {
                                    puff = pAVar11;
                                    if (pAVar11 == (AActor *)0x0) {
                                      local_118.Index = 0xcd;
                                      local_b8.Degrees = dVar18;
                                      local_b0.Degrees = dVar1;
                                      puff = P_LineAttack(origin,&local_b0,(double)local_78._0_8_,
                                                          &local_b8,0,&local_118,local_158,
                                                          (flags >> 3 & 2) + 8,
                                                          (FTranslatedLineTarget *)0x0,(int *)0x0);
                                    }
                                    if (puff != (AActor *)0x0) {
                                      AimBulletMissile(proj,puff,flags,pAVar11 == (AActor *)0x0,true
                                                      );
                                    }
                                  }
                                }
                                iVar4 = iVar4 + -1;
                              } while (iVar4 != 0);
                            }
                          }
                          return 0;
                        }
                        pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
                      }
                      __assert_fail(pcVar13,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x658,
                                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar13 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar13,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x651,
                                "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar13 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x650,
                            "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar13 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x64f,
                        "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar13 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x64e,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003caeff:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x64d,
                "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomBulletAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (range == 0)
		range = MISSILERANGE;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & CBAF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if (ref != NULL || (flags & CBAF_AIMFACING))
	{
		if (!(flags & CBAF_AIMFACING))
		{
			A_Face(self, ref);
		}
		bangle = self->Angles.Yaw;

		if (!(flags & CBAF_NOPITCH)) bslope = P_AimLineAttack (self, bangle, MISSILERANGE);
		if (pufftype == nullptr) pufftype = PClass::FindActor(NAME_BulletPuff);

		S_Sound (self, CHAN_WEAPON, self->AttackSound, 1, ATTN_NORM);
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & CBAF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & CBAF_NORANDOM))
				damage *= ((pr_cabullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);
			if (missile != nullptr && pufftype != nullptr)
			{
				double x = Spawnofs_xy * angle.Cos();
				double y = Spawnofs_xy * angle.Sin();
				
				DVector3 pos = self->Pos();
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				AActor *proj = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, missile, self->Angles.Yaw, 0, GetDefaultByType(missile)->Speed, self, false);
				self->SetXYZ(pos);
				
				if (proj)
				{
					bool temp = (puff == nullptr);
					if (!puff)
					{
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					if (puff)
					{			
						AimBulletMissile(proj, puff, flags, temp, true);
					}
				}
			}
		}
    }
	return 0;
}